

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::describeInterpolation
               (string *stage,VaryingInterpolation qual,ostringstream *name,ostringstream *desc)

{
  ostream *poVar1;
  char *__s;
  Interpolation interpolation;
  string qualName;
  allocator<char> local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  if (qual == VARYINGINTERPOLATION_DEFAULT) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)desc,", unqualified in ",0x11);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)desc,(stage->_M_dataplus)._M_p,stage->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," shader",7);
    return;
  }
  interpolation = INTERPOLATION_LAST;
  if (qual < VARYINGINTERPOLATION_DEFAULT) {
    interpolation = qual;
  }
  __s = glu::getInterpolationName(interpolation);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)name,"_",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)name,(stage->_M_dataplus)._M_p,stage->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)desc,", qualified \'",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)desc,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' in ",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(stage->_M_dataplus)._M_p,stage->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," shader",7);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void describeInterpolation (const string& stage, VaryingInterpolation qual,
							ostringstream& name, ostringstream& desc)
{
	DE_ASSERT(qual < VARYINGINTERPOLATION_RANDOM);

	if (qual == VARYINGINTERPOLATION_DEFAULT)
	{
		desc << ", unqualified in " << stage << " shader";
		return;
	}
	else
	{
		const string qualName = glu::getInterpolationName(getGluInterpolation(qual));

		name << "_" << stage << "_" << qualName;
		desc << ", qualified '" << qualName << "' in " << stage << " shader";
	}
}